

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O2

void board_print(Board *board,_Bool showDownCards)

{
  SPOTTYPE SVar1;
  ulong uVar2;
  ulong uVar3;
  uchar spotTypesCount;
  byte local_39;
  SPOTTYPE *local_38;
  
  local_38 = board_getSpotTypes(board,&local_39);
  for (uVar2 = 0; uVar2 < local_39; uVar2 = uVar2 + 1) {
    SVar1 = local_38[uVar2];
    for (uVar3 = 0; uVar3 < board->spotsCount; uVar3 = uVar3 + 1) {
      if (board->spots[uVar3]->type == SVar1) {
        spot_print(board->spots[uVar3],showDownCards);
      }
    }
  }
  free(local_38);
  return;
}

Assistant:

void board_print(Board * board, bool showDownCards)
{
	unsigned char i, j, spotTypesCount;
	Spot * spot;
	SPOTTYPE spotType;
	SPOTTYPE * spotTypes = board_getSpotTypes(board, &spotTypesCount);

	for(i=0;i<spotTypesCount;i++)
	{
		spotType = spotTypes[i];
		for(j=0;j<board->spotsCount;j++)
		{
			spot = board->spots[j];
			if(spot->type==spotType)
				spot_print(spot, showDownCards);
		}
	}

	free(spotTypes);
}